

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

void ucnv_MBCSLoad(UConverterSharedData *sharedData,UConverterLoadArgs *pArgs,uint8_t *raw,
                  UErrorCode *pErrorCode)

{
  byte bVar1;
  int32_t *piVar2;
  UBool UVar3;
  int iVar4;
  uint uVar5;
  UConverterMBCSTable *mbcsTable_00;
  UConverterSharedData *sharedData_00;
  int32_t (*__dest) [256];
  uint local_e4;
  uint32_t stage2Length;
  uint32_t stage1Length;
  int32_t i_2;
  uint32_t asciiRoundtrips;
  int32_t i_1;
  int32_t count;
  int32_t i;
  int32_t *state;
  int32_t (*newStateTable) [256];
  int32_t entry;
  char *baseName;
  int32_t *extIndexes;
  UConverterSharedData *baseSharedData;
  UConverterLoadArgs args;
  uint local_58;
  UBool noFromU;
  uint32_t headerLength;
  uint32_t offset;
  _MBCSHeader *header;
  UConverterMBCSTable *mbcsTable;
  UDataInfo info;
  UErrorCode *pErrorCode_local;
  uint8_t *raw_local;
  UConverterLoadArgs *pArgs_local;
  UConverterSharedData *sharedData_local;
  
  mbcsTable_00 = &sharedData->mbcs;
  args.locale._7_1_ = false;
  if (*raw == '\x04') {
    local_58 = 8;
  }
  else {
    if (((*raw != '\x05') || (raw[1] < 3)) || ((*(uint *)(raw + 0x20) & 0xff80) != 0)) {
      *pErrorCode = U_INVALID_TABLE_FORMAT;
      return;
    }
    local_58 = *(uint *)(raw + 0x20) & 0x3f;
    args.locale._7_1_ = (*(uint *)(raw + 0x20) & 0x40) != 0;
  }
  (sharedData->mbcs).outputType = (uint8_t)*(undefined4 *)(raw + 0x18);
  if (((bool)args.locale._7_1_ != false) && ((sharedData->mbcs).outputType == '\0')) {
    *pErrorCode = U_INVALID_TABLE_FORMAT;
    return;
  }
  if (*(uint *)(raw + 0x18) >> 8 != 0) {
    (sharedData->mbcs).extIndexes = (int32_t *)(raw + (*(uint *)(raw + 0x18) >> 8));
  }
  info._12_8_ = pErrorCode;
  if ((sharedData->mbcs).outputType == '\x0e') {
    memset(&baseSharedData,0,0x28);
    baseSharedData._0_4_ = 0x28;
    piVar2 = (sharedData->mbcs).extIndexes;
    if (piVar2 == (int32_t *)0x0) {
      *(undefined4 *)info._12_8_ = 0xd;
      return;
    }
    if (pArgs->nestedLoads != 1) {
      *(undefined4 *)info._12_8_ = 0xe;
      return;
    }
    iVar4 = strcmp((char *)(raw + (local_58 << 2)),sharedData->staticData->name);
    if (iVar4 == 0) {
      *(undefined4 *)info._12_8_ = 0xd;
      return;
    }
    baseSharedData._0_4_ = 0x28;
    baseSharedData._4_4_ = 2;
    args.size._0_1_ = pArgs->onlyTestIsLoadable;
    args.size._2_2_ = pArgs->reserved;
    args.nestedLoads = pArgs->options;
    args._8_8_ = pArgs->pkg;
    args.pkg = (char *)(raw + (local_58 << 2));
    sharedData_00 = ucnv_load_63((UConverterLoadArgs *)&baseSharedData,(UErrorCode *)info._12_8_);
    UVar3 = U_FAILURE(*(UErrorCode *)info._12_8_);
    if (UVar3 != '\0') {
      return;
    }
    if ((sharedData_00->staticData->conversionType != '\x02') ||
       ((sharedData_00->mbcs).baseSharedData != (UConverterSharedData *)0x0)) {
      ucnv_unload_63(sharedData_00);
      *(undefined4 *)info._12_8_ = 0xd;
      return;
    }
    if (pArgs->onlyTestIsLoadable != '\0') {
      ucnv_unload_63(sharedData_00);
      return;
    }
    memcpy(mbcsTable_00,&sharedData_00->mbcs,0xf8);
    (sharedData->mbcs).baseSharedData = sharedData_00;
    (sharedData->mbcs).extIndexes = piVar2;
    (sharedData->mbcs).swapLFNLStateTable = (int32_t (*) [256])0x0;
    (sharedData->mbcs).swapLFNLFromUnicodeBytes = (uint8_t *)0x0;
    (sharedData->mbcs).swapLFNLName = (char *)0x0;
    (sharedData->mbcs).reconstitutedData = (uint8_t *)0x0;
    if ((sharedData->staticData->conversionType == '\x01') ||
       ((sharedData->staticData->conversionType == '\x02' &&
        ('\x01' < sharedData->staticData->minBytesPerChar)))) {
      if ((sharedData_00->mbcs).outputType == '\f') {
        uVar5 = (*(sharedData->mbcs).stateTable)[0xe];
        if ((((int)uVar5 < 0) && ((uVar5 >> 0x14 & 0xf) == 8)) && ((uVar5 >> 0x18 & 0x7f) != 0)) {
          (sharedData->mbcs).dbcsOnlyState = (byte)(uVar5 >> 0x18) & 0x7f;
          (sharedData->mbcs).outputType = 0xdb;
        }
      }
      else if ((((sharedData_00->staticData->conversionType == '\x02') &&
                (sharedData_00->staticData->minBytesPerChar == '\x01')) &&
               (sharedData_00->staticData->maxBytesPerChar == '\x02')) &&
              (mbcsTable_00->countStates < 0x80)) {
        bVar1 = mbcsTable_00->countStates;
        uVar5 = (uint)bVar1;
        __dest = (int32_t (*) [256])uprv_malloc_63((long)(int)((uVar5 + 1) * 0x400));
        if (__dest == (int32_t (*) [256])0x0) {
          ucnv_unload_63(sharedData_00);
          *(undefined4 *)info._12_8_ = 7;
          return;
        }
        memcpy(__dest,(sharedData->mbcs).stateTable,(long)(int)(uVar5 << 10));
        for (i_1 = 0; i_1 < 0x100; i_1 = i_1 + 1) {
          if ((*__dest)[i_1] < 0) {
            (*__dest)[i_1] = uVar5 << 0x18;
          }
        }
        for (i_1 = 0; i_1 < 0x100; i_1 = i_1 + 1) {
          __dest[(int)uVar5][i_1] = -0x7f900000;
        }
        (sharedData->mbcs).stateTable = __dest;
        mbcsTable_00->countStates = bVar1 + 1;
        (sharedData->mbcs).stateTableOwned = '\x01';
        (sharedData->mbcs).outputType = 0xdb;
      }
    }
    goto LAB_0039aea4;
  }
  uVar5 = (uint)(sharedData->mbcs).outputType;
  if (((3 < uVar5) && (1 < uVar5 - 8)) && (uVar5 != 0xc)) {
    *pErrorCode = U_INVALID_TABLE_FORMAT;
    return;
  }
  if (pArgs->onlyTestIsLoadable != '\0') {
    return;
  }
  mbcsTable_00->countStates = (uint8_t)*(undefined4 *)(raw + 4);
  (sharedData->mbcs).countToUFallbacks = *(uint32_t *)(raw + 8);
  (sharedData->mbcs).stateTable = (int32_t (*) [256])(raw + (local_58 << 2));
  (sharedData->mbcs).toUFallbacks =
       (_MBCSToUFallback *)((sharedData->mbcs).stateTable + *(uint *)(raw + 4));
  (sharedData->mbcs).unicodeCodeUnits = (uint16_t *)(raw + *(uint *)(raw + 0xc));
  (sharedData->mbcs).fromUnicodeTable = (uint16_t *)(raw + *(uint *)(raw + 0x10));
  (sharedData->mbcs).fromUnicodeBytes = raw + *(uint *)(raw + 0x14);
  (sharedData->mbcs).fromUBytesLength = *(uint32_t *)(raw + 0x1c);
  mbcsTable._4_2_ = 0x14;
  udata_getInfo_63((UDataMemory *)sharedData->dataMemory,(UDataInfo *)((long)&mbcsTable + 4));
  if ((info.isBigEndian < 7) && ((info.isBigEndian != '\x06' || (info.charsetFamily == '\0')))) {
    (sharedData->mbcs).unicodeMask = '\x03';
  }
  else {
    (sharedData->mbcs).unicodeMask = sharedData->staticData->unicodeMask & 3;
  }
  if ((2 < raw[1]) && (((sharedData->mbcs).unicodeMask & 2) == 0)) {
    if (mbcsTable_00->countStates == '\x01') {
      if (0xe < raw[2]) {
LAB_0039acb5:
        (sharedData->mbcs).utf8Friendly = '\x01';
        if (mbcsTable_00->countStates == '\x01') {
          for (i_2 = 0; i_2 < 0x40; i_2 = i_2 + 1) {
            (sharedData->mbcs).sbcsIndex[i_2] =
                 (sharedData->mbcs).fromUnicodeTable
                 [(int)((uint)(sharedData->mbcs).fromUnicodeTable[i_2 >> 4] + (i_2 & 0xfU) * 4)];
          }
          (sharedData->mbcs).maxFastUChar = L'࿿';
        }
        else {
          if (args.locale._7_1_ == '\0') {
            local_e4 = (sharedData->mbcs).fromUBytesLength;
          }
          else {
            local_e4 = 0;
          }
          (sharedData->mbcs).mbcsIndex =
               (uint16_t *)((sharedData->mbcs).fromUnicodeBytes + local_e4);
          (sharedData->mbcs).maxFastUChar = (ushort)raw[2] << 8 | 0xff;
        }
      }
    }
    else if (0xd6 < raw[2]) goto LAB_0039acb5;
  }
  stage1Length = 0xffffffff;
  for (stage2Length = 0; (int)stage2Length < 0x80; stage2Length = stage2Length + 1) {
    if ((*(sharedData->mbcs).stateTable)[(int)stage2Length] != (stage2Length | 0x80000000)) {
      stage1Length = (1 << ((byte)((int)stage2Length >> 2) & 0x1f) ^ 0xffffffffU) & stage1Length;
    }
  }
  (sharedData->mbcs).asciiRoundtrips = stage1Length;
  if (args.locale._7_1_ != '\0') {
    uVar5 = 0x40;
    if (((sharedData->mbcs).unicodeMask & 1) != 0) {
      uVar5 = 0x440;
    }
    reconstituteData(mbcsTable_00,uVar5,
                     ((uint)(*(int *)(raw + 0x14) - *(int *)(raw + 0x10)) >> 2) - (uVar5 >> 1),
                     *(uint32_t *)(raw + 0x24),(UErrorCode *)info._12_8_);
  }
LAB_0039aea4:
  if ((sharedData->mbcs).utf8Friendly != '\0') {
    if (mbcsTable_00->countStates == '\x01') {
      sharedData->impl = &_SBCSUTF8Impl;
    }
    else if ((sharedData->mbcs).outputType == '\x01') {
      sharedData->impl = &_DBCSUTF8Impl;
    }
  }
  if (((sharedData->mbcs).outputType == 0xdb) || ((sharedData->mbcs).outputType == '\f')) {
    (sharedData->mbcs).asciiRoundtrips = 0;
  }
  return;
}

Assistant:

static void U_CALLCONV
ucnv_MBCSLoad(UConverterSharedData *sharedData,
          UConverterLoadArgs *pArgs,
          const uint8_t *raw,
          UErrorCode *pErrorCode) {
    UDataInfo info;
    UConverterMBCSTable *mbcsTable=&sharedData->mbcs;
    _MBCSHeader *header=(_MBCSHeader *)raw;
    uint32_t offset;
    uint32_t headerLength;
    UBool noFromU=FALSE;

    if(header->version[0]==4) {
        headerLength=MBCS_HEADER_V4_LENGTH;
    } else if(header->version[0]==5 && header->version[1]>=3 &&
              (header->options&MBCS_OPT_UNKNOWN_INCOMPATIBLE_MASK)==0) {
        headerLength=header->options&MBCS_OPT_LENGTH_MASK;
        noFromU=(UBool)((header->options&MBCS_OPT_NO_FROM_U)!=0);
    } else {
        *pErrorCode=U_INVALID_TABLE_FORMAT;
        return;
    }

    mbcsTable->outputType=(uint8_t)header->flags;
    if(noFromU && mbcsTable->outputType==MBCS_OUTPUT_1) {
        *pErrorCode=U_INVALID_TABLE_FORMAT;
        return;
    }

    /* extension data, header version 4.2 and higher */
    offset=header->flags>>8;
    if(offset!=0) {
        mbcsTable->extIndexes=(const int32_t *)(raw+offset);
    }

    if(mbcsTable->outputType==MBCS_OUTPUT_EXT_ONLY) {
        UConverterLoadArgs args=UCNV_LOAD_ARGS_INITIALIZER;
        UConverterSharedData *baseSharedData;
        const int32_t *extIndexes;
        const char *baseName;

        /* extension-only file, load the base table and set values appropriately */
        if((extIndexes=mbcsTable->extIndexes)==NULL) {
            /* extension-only file without extension */
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }

        if(pArgs->nestedLoads!=1) {
            /* an extension table must not be loaded as a base table */
            *pErrorCode=U_INVALID_TABLE_FILE;
            return;
        }

        /* load the base table */
        baseName=(const char *)header+headerLength*4;
        if(0==uprv_strcmp(baseName, sharedData->staticData->name)) {
            /* forbid loading this same extension-only file */
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }

        /* TODO parse package name out of the prefix of the base name in the extension .cnv file? */
        args.size=sizeof(UConverterLoadArgs);
        args.nestedLoads=2;
        args.onlyTestIsLoadable=pArgs->onlyTestIsLoadable;
        args.reserved=pArgs->reserved;
        args.options=pArgs->options;
        args.pkg=pArgs->pkg;
        args.name=baseName;
        baseSharedData=ucnv_load(&args, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            return;
        }
        if( baseSharedData->staticData->conversionType!=UCNV_MBCS ||
            baseSharedData->mbcs.baseSharedData!=NULL
        ) {
            ucnv_unload(baseSharedData);
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }
        if(pArgs->onlyTestIsLoadable) {
            /*
             * Exit as soon as we know that we can load the converter
             * and the format is valid and supported.
             * The worst that can happen in the following code is a memory
             * allocation error.
             */
            ucnv_unload(baseSharedData);
            return;
        }

        /* copy the base table data */
        uprv_memcpy(mbcsTable, &baseSharedData->mbcs, sizeof(UConverterMBCSTable));

        /* overwrite values with relevant ones for the extension converter */
        mbcsTable->baseSharedData=baseSharedData;
        mbcsTable->extIndexes=extIndexes;

        /*
         * It would be possible to share the swapLFNL data with a base converter,
         * but the generated name would have to be different, and the memory
         * would have to be free'd only once.
         * It is easier to just create the data for the extension converter
         * separately when it is requested.
         */
        mbcsTable->swapLFNLStateTable=NULL;
        mbcsTable->swapLFNLFromUnicodeBytes=NULL;
        mbcsTable->swapLFNLName=NULL;

        /*
         * The reconstitutedData must be deleted only when the base converter
         * is unloaded.
         */
        mbcsTable->reconstitutedData=NULL;

        /*
         * Set a special, runtime-only outputType if the extension converter
         * is a DBCS version of a base converter that also maps single bytes.
         */
        if( sharedData->staticData->conversionType==UCNV_DBCS ||
                (sharedData->staticData->conversionType==UCNV_MBCS &&
                 sharedData->staticData->minBytesPerChar>=2)
        ) {
            if(baseSharedData->mbcs.outputType==MBCS_OUTPUT_2_SISO) {
                /* the base converter is SI/SO-stateful */
                int32_t entry;

                /* get the dbcs state from the state table entry for SO=0x0e */
                entry=mbcsTable->stateTable[0][0xe];
                if( MBCS_ENTRY_IS_FINAL(entry) &&
                    MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_CHANGE_ONLY &&
                    MBCS_ENTRY_FINAL_STATE(entry)!=0
                ) {
                    mbcsTable->dbcsOnlyState=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry);

                    mbcsTable->outputType=MBCS_OUTPUT_DBCS_ONLY;
                }
            } else if(
                baseSharedData->staticData->conversionType==UCNV_MBCS &&
                baseSharedData->staticData->minBytesPerChar==1 &&
                baseSharedData->staticData->maxBytesPerChar==2 &&
                mbcsTable->countStates<=127
            ) {
                /* non-stateful base converter, need to modify the state table */
                int32_t (*newStateTable)[256];
                int32_t *state;
                int32_t i, count;

                /* allocate a new state table and copy the base state table contents */
                count=mbcsTable->countStates;
                newStateTable=(int32_t (*)[256])uprv_malloc((count+1)*1024);
                if(newStateTable==NULL) {
                    ucnv_unload(baseSharedData);
                    *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
                    return;
                }

                uprv_memcpy(newStateTable, mbcsTable->stateTable, count*1024);

                /* change all final single-byte entries to go to a new all-illegal state */
                state=newStateTable[0];
                for(i=0; i<256; ++i) {
                    if(MBCS_ENTRY_IS_FINAL(state[i])) {
                        state[i]=MBCS_ENTRY_TRANSITION(count, 0);
                    }
                }

                /* build the new all-illegal state */
                state=newStateTable[count];
                for(i=0; i<256; ++i) {
                    state[i]=MBCS_ENTRY_FINAL(0, MBCS_STATE_ILLEGAL, 0);
                }
                mbcsTable->stateTable=(const int32_t (*)[256])newStateTable;
                mbcsTable->countStates=(uint8_t)(count+1);
                mbcsTable->stateTableOwned=TRUE;

                mbcsTable->outputType=MBCS_OUTPUT_DBCS_ONLY;
            }
        }

        /*
         * unlike below for files with base tables, do not get the unicodeMask
         * from the sharedData; instead, use the base table's unicodeMask,
         * which we copied in the memcpy above;
         * this is necessary because the static data unicodeMask, especially
         * the UCNV_HAS_SUPPLEMENTARY flag, is part of the base table data
         */
    } else {
        /* conversion file with a base table; an additional extension table is optional */
        /* make sure that the output type is known */
        switch(mbcsTable->outputType) {
        case MBCS_OUTPUT_1:
        case MBCS_OUTPUT_2:
        case MBCS_OUTPUT_3:
        case MBCS_OUTPUT_4:
        case MBCS_OUTPUT_3_EUC:
        case MBCS_OUTPUT_4_EUC:
        case MBCS_OUTPUT_2_SISO:
            /* OK */
            break;
        default:
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }
        if(pArgs->onlyTestIsLoadable) {
            /*
             * Exit as soon as we know that we can load the converter
             * and the format is valid and supported.
             * The worst that can happen in the following code is a memory
             * allocation error.
             */
            return;
        }

        mbcsTable->countStates=(uint8_t)header->countStates;
        mbcsTable->countToUFallbacks=header->countToUFallbacks;
        mbcsTable->stateTable=(const int32_t (*)[256])(raw+headerLength*4);
        mbcsTable->toUFallbacks=(const _MBCSToUFallback *)(mbcsTable->stateTable+header->countStates);
        mbcsTable->unicodeCodeUnits=(const uint16_t *)(raw+header->offsetToUCodeUnits);

        mbcsTable->fromUnicodeTable=(const uint16_t *)(raw+header->offsetFromUTable);
        mbcsTable->fromUnicodeBytes=(const uint8_t *)(raw+header->offsetFromUBytes);
        mbcsTable->fromUBytesLength=header->fromUBytesLength;

        /*
         * converter versions 6.1 and up contain a unicodeMask that is
         * used here to select the most efficient function implementations
         */
        info.size=sizeof(UDataInfo);
        udata_getInfo((UDataMemory *)sharedData->dataMemory, &info);
        if(info.formatVersion[0]>6 || (info.formatVersion[0]==6 && info.formatVersion[1]>=1)) {
            /* mask off possible future extensions to be safe */
            mbcsTable->unicodeMask=(uint8_t)(sharedData->staticData->unicodeMask&3);
        } else {
            /* for older versions, assume worst case: contains anything possible (prevent over-optimizations) */
            mbcsTable->unicodeMask=UCNV_HAS_SUPPLEMENTARY|UCNV_HAS_SURROGATES;
        }

        /*
         * _MBCSHeader.version 4.3 adds utf8Friendly data structures.
         * Check for the header version, SBCS vs. MBCS, and for whether the
         * data structures are optimized for code points as high as what the
         * runtime code is designed for.
         * The implementation does not handle mapping tables with entries for
         * unpaired surrogates.
         */
        if( header->version[1]>=3 &&
            (mbcsTable->unicodeMask&UCNV_HAS_SURROGATES)==0 &&
            (mbcsTable->countStates==1 ?
                (header->version[2]>=(SBCS_FAST_MAX>>8)) :
                (header->version[2]>=(MBCS_FAST_MAX>>8))
            )
        ) {
            mbcsTable->utf8Friendly=TRUE;

            if(mbcsTable->countStates==1) {
                /*
                 * SBCS: Stage 3 is allocated in 64-entry blocks for U+0000..SBCS_FAST_MAX or higher.
                 * Build a table with indexes to each block, to be used instead of
                 * the regular stage 1/2 table.
                 */
                int32_t i;
                for(i=0; i<(SBCS_FAST_LIMIT>>6); ++i) {
                    mbcsTable->sbcsIndex[i]=mbcsTable->fromUnicodeTable[mbcsTable->fromUnicodeTable[i>>4]+((i<<2)&0x3c)];
                }
                /* set SBCS_FAST_MAX to reflect the reach of sbcsIndex[] even if header->version[2]>(SBCS_FAST_MAX>>8) */
                mbcsTable->maxFastUChar=SBCS_FAST_MAX;
            } else {
                /*
                 * MBCS: Stage 3 is allocated in 64-entry blocks for U+0000..MBCS_FAST_MAX or higher.
                 * The .cnv file is prebuilt with an additional stage table with indexes
                 * to each block.
                 */
                mbcsTable->mbcsIndex=(const uint16_t *)
                    (mbcsTable->fromUnicodeBytes+
                     (noFromU ? 0 : mbcsTable->fromUBytesLength));
                mbcsTable->maxFastUChar=(((UChar)header->version[2])<<8)|0xff;
            }
        }

        /* calculate a bit set of 4 ASCII characters per bit that round-trip to ASCII bytes */
        {
            uint32_t asciiRoundtrips=0xffffffff;
            int32_t i;

            for(i=0; i<0x80; ++i) {
                if(mbcsTable->stateTable[0][i]!=MBCS_ENTRY_FINAL(0, MBCS_STATE_VALID_DIRECT_16, i)) {
                    asciiRoundtrips&=~((uint32_t)1<<(i>>2));
                }
            }
            mbcsTable->asciiRoundtrips=asciiRoundtrips;
        }

        if(noFromU) {
            uint32_t stage1Length=
                mbcsTable->unicodeMask&UCNV_HAS_SUPPLEMENTARY ?
                    0x440 : 0x40;
            uint32_t stage2Length=
                (header->offsetFromUBytes-header->offsetFromUTable)/4-
                stage1Length/2;
            reconstituteData(mbcsTable, stage1Length, stage2Length, header->fullStage2Length, pErrorCode);
        }
    }

    /* Set the impl pointer here so that it is set for both extension-only and base tables. */
    if(mbcsTable->utf8Friendly) {
        if(mbcsTable->countStates==1) {
            sharedData->impl=&_SBCSUTF8Impl;
        } else {
            if(mbcsTable->outputType==MBCS_OUTPUT_2) {
                sharedData->impl=&_DBCSUTF8Impl;
            }
        }
    }

    if(mbcsTable->outputType==MBCS_OUTPUT_DBCS_ONLY || mbcsTable->outputType==MBCS_OUTPUT_2_SISO) {
        /*
         * MBCS_OUTPUT_DBCS_ONLY: No SBCS mappings, therefore ASCII does not roundtrip.
         * MBCS_OUTPUT_2_SISO: Bypass the ASCII fastpath to handle prevLength correctly.
         */
        mbcsTable->asciiRoundtrips=0;
    }
}